

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O3

int wally_tx_get_total_output_satoshi(wally_tx *tx,uint64_t *value_out)

{
  _Bool _Var1;
  wally_tx_output *pwVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  iVar4 = -2;
  if (value_out != (uint64_t *)0x0) {
    *value_out = 0;
    _Var1 = is_valid_tx(tx);
    if (_Var1) {
      if (tx->num_outputs != 0) {
        pwVar2 = tx->outputs;
        uVar3 = 0;
        uVar6 = 0;
        do {
          if (((2100000000000000 < pwVar2->satoshi) ||
              (uVar5 = pwVar2->satoshi + uVar6, uVar5 < uVar6)) || (2100000000000000 < uVar5)) {
            *value_out = 0;
            return -2;
          }
          *value_out = uVar5;
          uVar3 = uVar3 + 1;
          pwVar2 = pwVar2 + 1;
          uVar6 = uVar5;
        } while (uVar3 < tx->num_outputs);
      }
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int wally_tx_get_total_output_satoshi(const struct wally_tx *tx, uint64_t *value_out)
{
    size_t i;
    if (value_out)
        *value_out = 0;

    if (!is_valid_tx(tx) || !value_out)
        return WALLY_EINVAL;

    for (i = 0; i < tx->num_outputs; ++i) {
        uint64_t v = *value_out + tx->outputs[i].satoshi;

        if (tx->outputs[i].satoshi > WALLY_SATOSHI_MAX ||
            v < *value_out || v > WALLY_SATOSHI_MAX) {
            /* Overflow or too many satoshi in outputs */
            *value_out = 0;
            return WALLY_EINVAL;
        }
        *value_out = v;
    }

    return WALLY_OK;
}